

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

bool __thiscall
UnconstrainedEquation::resolveOperandLeft(UnconstrainedEquation *this,OperandResolve *state)

{
  int4 iVar1;
  
  state->cur_rightmost = -1;
  iVar1 = -1;
  if (((this->super_PatternEquation).resultpattern.leftellipsis == false) &&
     ((this->super_PatternEquation).resultpattern.rightellipsis == false)) {
    iVar1 = TokenPattern::getMinimumLength(&(this->super_PatternEquation).resultpattern);
  }
  state->size = iVar1;
  return true;
}

Assistant:

bool UnconstrainedEquation::resolveOperandLeft(OperandResolve &state) const

{
  state.cur_rightmost = -1;
  if (resultpattern.getLeftEllipsis()||resultpattern.getRightEllipsis()) // don't know length
    state.size = -1;
  else
    state.size = resultpattern.getMinimumLength();
  return true;
}